

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O0

Flow * __thiscall
wasm::PrecomputingExpressionRunner::visitArrayGet
          (Flow *__return_storage_ptr__,PrecomputingExpressionRunner *this,ArrayGet *curr)

{
  Name breakTo;
  Type TVar1;
  bool bVar2;
  byte local_61;
  HeapType local_48;
  uintptr_t local_40;
  uintptr_t local_38;
  Field element;
  ArrayGet *curr_local;
  PrecomputingExpressionRunner *this_local;
  
  element.mutable_ = Mutable;
  bVar2 = wasm::Type::operator!=(&curr->ref->type,&element.mutable_);
  local_61 = 0;
  if (bVar2) {
    bVar2 = wasm::Type::isNull(&curr->ref->type);
    local_61 = bVar2 ^ 0xff;
  }
  if ((local_61 & 1) != 0) {
    wasm::Type::getHeapType(&curr->ref->type);
    HeapType::getArray(&local_48);
    local_38 = local_48.id;
    element.type.id = local_40;
    TVar1.id = element.type.id;
    element.type.id._4_4_ = (int)(local_40 >> 0x20);
    bVar2 = element.type.id._4_4_ == 0;
    element.type.id = TVar1.id;
    if (bVar2) {
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitArrayGet
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,curr);
      return __return_storage_ptr__;
    }
  }
  breakTo.super_IString.str._M_str = DAT_027e5710;
  breakTo.super_IString.str._M_len = NONCONSTANT_FLOW;
  Flow::Flow(__return_storage_ptr__,breakTo);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayGet(ArrayGet* curr) {
    if (curr->ref->type != Type::unreachable && !curr->ref->type.isNull()) {
      // See above with struct.get
      auto element = curr->ref->type.getHeapType().getArray().element;
      if (element.mutable_ == Immutable) {
        return Super::visitArrayGet(curr);
      }
    }

    // Otherwise, we've failed to precompute.
    return Flow(NONCONSTANT_FLOW);
  }